

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spread_volatile_semantics.cpp
# Opt level: O3

Status __thiscall
spvtools::opt::SpreadVolatileSemantics::SpreadVolatileSemanticsToVariables
          (SpreadVolatileSemantics *this,bool is_vk_memory_model_enabled)

{
  Module *pMVar1;
  uint32_t var_id;
  Status SVar2;
  Instruction *pIVar3;
  Instruction *var;
  Instruction *this_00;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  entry_function_ids;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  _Stack_68;
  
  pMVar1 = (((this->super_Pass).context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  this_00 = *(Instruction **)
             ((long)&(pMVar1->types_values_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10)
  ;
  pIVar3 = (Instruction *)
           ((long)&(pMVar1->types_values_).super_IntrusiveList<spvtools::opt::Instruction> + 8);
  if (this_00 == pIVar3) {
    SVar2 = SuccessWithoutChange;
  }
  else {
    SVar2 = SuccessWithoutChange;
    do {
      var_id = 0;
      if (this_00->has_result_id_ == true) {
        var_id = Instruction::GetSingleWordOperand(this_00,(uint)this_00->has_type_id_);
      }
      EntryFunctionsToSpreadVolatileSemanticsForVar
                ((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                  *)&_Stack_68,this,var_id);
      if (_Stack_68._M_element_count != 0) {
        if (is_vk_memory_model_enabled) {
          SetVolatileForLoadsInEntries
                    (this,this_00,
                     (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                      *)&_Stack_68);
        }
        else {
          DecorateVarWithVolatile(this,this_00);
        }
        SVar2 = SuccessWithChange;
      }
      std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&_Stack_68);
      this_00 = (this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (this_00 != pIVar3);
  }
  return SVar2;
}

Assistant:

Pass::Status SpreadVolatileSemantics::SpreadVolatileSemanticsToVariables(
    const bool is_vk_memory_model_enabled) {
  Status status = Status::SuccessWithoutChange;
  for (Instruction& var : context()->types_values()) {
    auto entry_function_ids =
        EntryFunctionsToSpreadVolatileSemanticsForVar(var.result_id());
    if (entry_function_ids.empty()) {
      continue;
    }

    if (is_vk_memory_model_enabled) {
      SetVolatileForLoadsInEntries(&var, entry_function_ids);
    } else {
      DecorateVarWithVolatile(&var);
    }
    status = Status::SuccessWithChange;
  }
  return status;
}